

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basetableref.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::BaseTableRef::Copy(BaseTableRef *this)

{
  _Head_base<0UL,_duckdb::AtClause_*,_false> __ptr_00;
  _Head_base<0UL,_duckdb::AtClause_*,_false> _Var1;
  BaseTableRef *this_00;
  pointer pBVar2;
  type target;
  pointer *__ptr;
  TableRef *in_RSI;
  _Head_base<0UL,_duckdb::AtClause_*,_false> local_28;
  _Head_base<0UL,_duckdb::BaseTableRef_*,_false> local_20;
  
  this_00 = (BaseTableRef *)operator_new(0xd0);
  BaseTableRef(this_00);
  local_20._M_head_impl = this_00;
  pBVar2 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_20);
  ::std::__cxx11::string::_M_assign((string *)&pBVar2->catalog_name);
  pBVar2 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_20);
  ::std::__cxx11::string::_M_assign((string *)&pBVar2->schema_name);
  pBVar2 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_20);
  ::std::__cxx11::string::_M_assign((string *)&pBVar2->table_name);
  pBVar2 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_20);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(pBVar2->super_TableRef).column_name_alias,
              &(in_RSI->column_name_alias).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  if (in_RSI[1].column_name_alias.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    local_28._M_head_impl = (AtClause *)0x0;
  }
  else {
    unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true>::operator->
              ((unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> *)
               &in_RSI[1].column_name_alias.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    AtClause::Copy((AtClause *)&local_28);
  }
  pBVar2 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_20);
  _Var1._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (AtClause *)0x0;
  __ptr_00._M_head_impl =
       (pBVar2->at_clause).
       super_unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
       super___uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
       super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl;
  (pBVar2->at_clause).super_unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>.
  _M_t.super___uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
  super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (__ptr_00._M_head_impl != (AtClause *)0x0) {
    ::std::default_delete<duckdb::AtClause>::operator()
              ((default_delete<duckdb::AtClause> *)&pBVar2->at_clause,__ptr_00._M_head_impl);
    if (local_28._M_head_impl != (AtClause *)0x0) {
      ::std::default_delete<duckdb::AtClause>::operator()
                ((default_delete<duckdb::AtClause> *)&local_28,local_28._M_head_impl);
    }
  }
  target = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator*((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                      *)&local_20);
  TableRef::CopyProperties(in_RSI,&target->super_TableRef);
  (this->super_TableRef)._vptr_TableRef = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> BaseTableRef::Copy() {
	auto copy = make_uniq<BaseTableRef>();

	copy->catalog_name = catalog_name;
	copy->schema_name = schema_name;
	copy->table_name = table_name;
	copy->column_name_alias = column_name_alias;
	copy->at_clause = at_clause ? at_clause->Copy() : nullptr;
	CopyProperties(*copy);

	return std::move(copy);
}